

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int updateMapping(Rtree *pRtree,i64 iRowid,RtreeNode *pNode,int iHeight)

{
  RtreeNode **ppRVar1;
  int iVar2;
  RtreeNode *pRVar3;
  code *UNRECOVERED_JUMPTABLE;
  RtreeNode *pRVar4;
  
  UNRECOVERED_JUMPTABLE = parentWrite;
  if (iHeight == 0) {
    UNRECOVERED_JUMPTABLE = rowidWrite;
  }
  if (0 < iHeight) {
    iVar2 = (int)((iRowid & 0xffffffffU) * 0x51d07eaf >> 0x20);
    for (pRVar4 = pRtree->aHash
                  [(int)iRowid + (((uint)((int)iRowid - iVar2) >> 1) + iVar2 >> 6) * -0x61];
        pRVar4 != (RtreeNode *)0x0; pRVar4 = pRVar4->pNext) {
      if (pRVar4->iNode == iRowid) goto LAB_001faa89;
    }
    pRVar4 = (RtreeNode *)0x0;
LAB_001faa89:
    pRVar3 = pNode;
    if (pNode == (RtreeNode *)0x0) {
      if (pRVar4 == (RtreeNode *)0x0) goto LAB_001faad8;
      nodeRelease(pRtree,pRVar4->pParent);
    }
    else {
      do {
        if (pRVar3 == pRVar4) {
          return 0x10b;
        }
        ppRVar1 = &pRVar3->pParent;
        pRVar3 = *ppRVar1;
      } while (*ppRVar1 != (RtreeNode *)0x0);
      if (pRVar4 == (RtreeNode *)0x0) goto LAB_001faad8;
      nodeRelease(pRtree,pRVar4->pParent);
      if (pNode != (RtreeNode *)0x0) {
        pNode->nRef = pNode->nRef + 1;
      }
    }
    pRVar4->pParent = pNode;
  }
LAB_001faad8:
  iVar2 = (*UNRECOVERED_JUMPTABLE)(pRtree,iRowid,pNode->iNode);
  return iVar2;
}

Assistant:

static int updateMapping(
  Rtree *pRtree,
  i64 iRowid,
  RtreeNode *pNode,
  int iHeight
){
  int (*xSetMapping)(Rtree *, sqlite3_int64, sqlite3_int64);
  xSetMapping = ((iHeight==0)?rowidWrite:parentWrite);
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, iRowid);
    RtreeNode *p;
    for(p=pNode; p; p=p->pParent){
      if( p==pChild ) return SQLITE_CORRUPT_VTAB;
    }
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  if( NEVER(pNode==0) ) return SQLITE_ERROR;
  return xSetMapping(pRtree, iRowid, pNode->iNode);
}